

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

QDate __thiscall QDate::addMonths(QDate *this,int nmonths)

{
  _Storage<long_long,_true> jd;
  int year;
  int iVar1;
  int iVar2;
  uint uVar3;
  _Storage<long_long,_true> _Var4;
  _Storage<long_long,_true> _Var5;
  ulong uVar6;
  ulong uVar7;
  int month;
  optional<long_long> oVar8;
  YearMonthDay YVar9;
  
  _Var4._M_value = -0x8000000000000000;
  jd = (_Storage<long_long,_true>)this->jd;
  _Var5._M_value = _Var4._M_value;
  if ((0xfffffe92c1eb868b < jd._M_value - 0xb69f248055U) && (_Var5 = jd, nmonths != 0)) {
    YVar9 = QGregorianCalendar::partsFromJulian(jd._M_value);
    _Var5._M_value = _Var4._M_value;
    if (YVar9._0_8_ >> 0x20 != 0x80000000) {
      iVar2 = YVar9.month + nmonths;
      uVar6 = CONCAT44(iVar2,YVar9.year);
      if (iVar2 < 1) {
        do {
          uVar3 = (int)uVar6 - 1;
          uVar7 = (uVar6 & 0xffffffff00000000) + 0xc00000000;
          if (uVar3 == 0) {
            uVar7 = uVar6 & 0xffffffff00000000;
          }
          uVar6 = uVar7 | uVar3;
        } while ((int)(uVar7 >> 0x20) == 0 || (long)uVar7 < 0);
      }
      iVar2 = (int)(uVar6 >> 0x20);
      uVar7 = uVar6;
      while (year = (int)uVar7, 0xc < iVar2) {
        uVar6 = (uVar7 & 0xffffffff00000000) - 0xc00000000;
        uVar7 = year + 1 + (uint)(year == -1) | uVar6;
        iVar2 = (int)(uVar6 >> 0x20);
      }
      if (year != 0) {
        month = (int)(uVar6 >> 0x20);
        iVar1 = QGregorianCalendar::monthLength(month,year);
        iVar2 = YVar9.day;
        if (iVar1 < YVar9.day) {
          iVar2 = iVar1;
        }
        oVar8 = QGregorianCalendar::julianFromParts(year,month,iVar2);
        if ((((undefined1  [16])
              oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
              super__Optional_payload_base<long_long> & (undefined1  [16])0x1) !=
             (undefined1  [16])0x0) &&
           (0xfffffe92c1eb868b <
            oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
            super__Optional_payload_base<long_long>._M_payload - 0xb69f248055U)) {
          _Var5._M_value =
               oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
               super__Optional_payload_base<long_long>._M_payload;
        }
      }
    }
  }
  return (QDate)_Var5._M_value;
}

Assistant:

QDate QDate::addMonths(int nmonths) const
{
    if (isNull())
        return QDate();

    if (nmonths == 0)
        return *this;

    auto parts = QGregorianCalendar::partsFromJulian(jd);

    if (!parts.isValid())
        return QDate();
    Q_ASSERT(parts.year);

    parts.month += nmonths;
    while (parts.month <= 0) {
        if (--parts.year) // skip over year 0
            parts.month += 12;
    }
    while (parts.month > 12) {
        parts.month -= 12;
        if (!++parts.year) // skip over year 0
            ++parts.year;
    }

    return fixedDate(parts);
}